

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp3::sPolynomial7
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0x8b];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0xab];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x43] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x9a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xba] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x52] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xa9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x61] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xb8] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xc9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x70] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[199] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x8e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage
        .m_data.array[0xd8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x9d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage
        .m_data.array[0xe7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xac] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xd6] / dVar1;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0xf4];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xbb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xe5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xf6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xca] = dVar3 / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xe8] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage
        .m_data.array[0x105] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xf7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x103] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::sPolynomial7( Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  groebnerMatrix(7,4) = (groebnerMatrix(4,10)/(groebnerMatrix(4,9))-groebnerMatrix(6,12)/(groebnerMatrix(6,11)));
  groebnerMatrix(7,5) = groebnerMatrix(4,11)/(groebnerMatrix(4,9));
  groebnerMatrix(7,6) = (groebnerMatrix(4,12)/(groebnerMatrix(4,9))-groebnerMatrix(6,13)/(groebnerMatrix(6,11)));
  groebnerMatrix(7,7) = groebnerMatrix(4,13)/(groebnerMatrix(4,9));
  groebnerMatrix(7,9) = -groebnerMatrix(6,14)/(groebnerMatrix(6,11));
  groebnerMatrix(7,10) = -groebnerMatrix(6,15)/(groebnerMatrix(6,11));
  groebnerMatrix(7,11) = groebnerMatrix(4,14)/(groebnerMatrix(4,9));
  groebnerMatrix(7,12) = (groebnerMatrix(4,15)/(groebnerMatrix(4,9))-groebnerMatrix(6,16)/(groebnerMatrix(6,11)));
  groebnerMatrix(7,13) = groebnerMatrix(4,16)/(groebnerMatrix(4,9));
  groebnerMatrix(7,15) = -groebnerMatrix(6,17)/(groebnerMatrix(6,11));
  groebnerMatrix(7,16) = groebnerMatrix(4,17)/(groebnerMatrix(4,9));
}